

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongestEdgeBisection.h
# Opt level: O0

void leb_ResetToDepth(leb_Heap *leb,int depth)

{
  leb_Node node_00;
  leb_Node node;
  uint32_t nodeID;
  uint32_t maxNodeID;
  uint32_t minNodeID;
  int depth_local;
  leb_Heap *leb_local;
  
  if (depth < leb->minDepth) {
    __assert_fail("depth >= leb->minDepth && \"depth must be at least equal to minDepth\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                  ,0x270,"void leb_ResetToDepth(leb_Heap *, int)");
  }
  if (leb->maxDepth < depth) {
    __assert_fail("depth <= leb->maxDepth && \"depth must be at most equal to maxDepth\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/LongestEdgeBisection/LongestEdgeBisection.h"
                  ,0x271,"void leb_ResetToDepth(leb_Heap *, int)");
  }
  leb__ClearBuffer(leb);
  for (node.id = 1 << ((byte)depth & 0x1f); node.id < (uint)(2 << ((byte)depth & 0x1f));
      node.id = node.id + 1) {
    node_00.depth = depth;
    node_00.id = node.id;
    leb__HeapWrite_BitField(leb,node_00,1);
  }
  leb_ComputeSumReduction(leb);
  return;
}

Assistant:

LEBDEF void leb_ResetToDepth(leb_Heap *leb, int depth)
{
    LEB_ASSERT(depth >= leb->minDepth && "depth must be at least equal to minDepth");
    LEB_ASSERT(depth <= leb->maxDepth && "depth must be at most equal to maxDepth");
    uint32_t minNodeID = 1u << depth;
    uint32_t maxNodeID = 2u << depth;

    leb__ClearBuffer(leb);

    for (uint32_t nodeID = minNodeID; nodeID < maxNodeID; ++nodeID) {
        leb_Node node = {nodeID, depth};

        leb__HeapWrite_BitField(leb, node, 1u);
    }

    leb_ComputeSumReduction(leb);
}